

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_counters.cpp
# Opt level: O2

void __thiscall
libtorrent::counters::blend_stats_counter(counters *this,int c,int64_t value,int ratio)

{
  atomic<long> *paVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = (this->m_stats_counter).super_array<std::atomic<long>,_291UL>._M_elems[c].
          super___atomic_base<long>._M_i;
  do {
    paVar1 = (this->m_stats_counter).super_array<std::atomic<long>,_291UL>._M_elems + c;
    LOCK();
    lVar2 = (paVar1->super___atomic_base<long>)._M_i;
    bVar4 = lVar3 == lVar2;
    if (bVar4) {
      (paVar1->super___atomic_base<long>)._M_i = (lVar3 * (100 - ratio) + ratio * value) / 100;
      lVar2 = lVar3;
    }
    UNLOCK();
    lVar3 = lVar2;
  } while (!bVar4);
  return;
}

Assistant:

void counters::blend_stats_counter(int const c, std::int64_t const value, int const ratio) TORRENT_COUNTER_NOEXCEPT
	{
		TORRENT_ASSERT(c >= num_stats_counters);
		TORRENT_ASSERT(c < num_counters);
		TORRENT_ASSERT(ratio >= 0);
		TORRENT_ASSERT(ratio <= 100);

#ifdef ATOMIC_LLONG_LOCK_FREE
		std::int64_t current = m_stats_counter[c].load(std::memory_order_relaxed);
		std::int64_t new_value = (current * (100 - ratio) + value * ratio) / 100;

		while (!m_stats_counter[c].compare_exchange_weak(current, new_value
			, std::memory_order_relaxed))
		{
			new_value = (current * (100 - ratio) + value * ratio) / 100;
		}
#else
		std::lock_guard<std::mutex> l(m_mutex);
		std::int64_t current = m_stats_counter[c];
		m_stats_counter[c] = (current * (100 - ratio) + value * ratio) / 100;
#endif
	}